

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

void xlsxioread_list_sheets
               (xlsxioreader handle,xlsxioread_list_sheets_callback_fn callback,void *callbackdata)

{
  main_sheet_list_callback_data sheetcallbackdata;
  unzFile *local_68;
  char *local_60;
  code *local_58;
  XML_Parser *local_50;
  XML_Parser local_48;
  xlsxioread_list_sheets_callback_fn local_40;
  void *local_38;
  
  if (callback != (xlsxioread_list_sheets_callback_fn)0x0 && handle != (xlsxioreader)0x0) {
    local_48 = (XML_Parser)0x0;
    local_68 = handle->zip;
    local_60 = "application/vnd.openxmlformats-officedocument.spreadsheetml.sheet.main+xml";
    local_58 = xlsxioread_list_sheets_callback;
    local_50 = &local_48;
    local_40 = callback;
    local_38 = callbackdata;
    expat_process_zip_file
              (local_68,"[Content_Types].xml",
               iterate_files_by_contenttype_expat_callback_element_start,(XML_EndElementHandler)0x0,
               (XML_CharacterDataHandler)0x0,&local_68,&local_48);
    local_68 = handle->zip;
    local_60 = "application/vnd.ms-excel.sheet.macroEnabled.main+xml";
    local_58 = xlsxioread_list_sheets_callback;
    local_50 = &local_48;
    expat_process_zip_file
              (local_68,"[Content_Types].xml",
               iterate_files_by_contenttype_expat_callback_element_start,(XML_EndElementHandler)0x0,
               (XML_CharacterDataHandler)0x0,&local_68,&local_48);
    local_68 = handle->zip;
    local_60 = "application/vnd.openxmlformats-officedocument.spreadsheetml.template.main+xml";
    local_58 = xlsxioread_list_sheets_callback;
    local_50 = &local_48;
    expat_process_zip_file
              (local_68,"[Content_Types].xml",
               iterate_files_by_contenttype_expat_callback_element_start,(XML_EndElementHandler)0x0,
               (XML_CharacterDataHandler)0x0,&local_68,&local_48);
    local_68 = handle->zip;
    local_60 = "application/vnd.ms-excel.template.macroEnabled.main+xml";
    local_58 = xlsxioread_list_sheets_callback;
    local_50 = &local_48;
    expat_process_zip_file
              (local_68,"[Content_Types].xml",
               iterate_files_by_contenttype_expat_callback_element_start,(XML_EndElementHandler)0x0,
               (XML_CharacterDataHandler)0x0,&local_68,&local_48);
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxioread_list_sheets (xlsxioreader handle, xlsxioread_list_sheets_callback_fn callback, void* callbackdata)
{
  if (!handle || !callback)
    return;
  //process contents of main sheet
  struct main_sheet_list_callback_data sheetcallbackdata = {
    .xmlparser = NULL,
    .callback = callback,
    .callbackdata = callbackdata
  };
  iterate_files_by_contenttype(handle->zip, xlsx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xlsm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
}